

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O3

uint64_t aom_sum_sse_2d_i16_4xn_sse2(int16_t *src,int stride,int height,int *sum)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar5 = _DAT_005137c0;
  iVar8 = *sum;
  iVar7 = 0;
  uVar6 = 0;
  do {
    uVar1 = *(undefined8 *)src;
    uVar2 = *(undefined8 *)(src + stride);
    auVar9._8_8_ = uVar2;
    auVar9._0_8_ = uVar1;
    uVar3 = *(undefined8 *)(src + stride * 2);
    uVar4 = *(undefined8 *)(src + stride * 3);
    auVar10._8_8_ = uVar4;
    auVar10._0_8_ = uVar3;
    auVar11._0_2_ = (short)uVar3 + (short)uVar1;
    auVar11._2_2_ = (short)((ulong)uVar3 >> 0x10) + (short)((ulong)uVar1 >> 0x10);
    auVar11._4_2_ = (short)((ulong)uVar3 >> 0x20) + (short)((ulong)uVar1 >> 0x20);
    auVar11._6_2_ = (short)((ulong)uVar3 >> 0x30) + (short)((ulong)uVar1 >> 0x30);
    auVar11._8_2_ = (short)uVar4 + (short)uVar2;
    auVar11._10_2_ = (short)((ulong)uVar4 >> 0x10) + (short)((ulong)uVar2 >> 0x10);
    auVar11._12_2_ = (short)((ulong)uVar4 >> 0x20) + (short)((ulong)uVar2 >> 0x20);
    auVar11._14_2_ = (short)((ulong)uVar4 >> 0x30) + (short)((ulong)uVar2 >> 0x30);
    auVar11 = pmaddwd(auVar11,auVar5);
    iVar8 = iVar8 + auVar11._12_4_ + auVar11._4_4_ + auVar11._8_4_ + auVar11._0_4_;
    auVar9 = pmaddwd(auVar9,auVar9);
    auVar10 = pmaddwd(auVar10,auVar10);
    uVar6 = uVar6 + (long)(auVar10._12_4_ + auVar9._12_4_ + auVar10._4_4_ + auVar9._4_4_ +
                          auVar10._8_4_ + auVar9._8_4_ + auVar10._0_4_ + auVar9._0_4_);
    *sum = iVar8;
    iVar7 = iVar7 + 4;
    src = src + stride * 4;
  } while (iVar7 < height);
  return uVar6;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_4xn_sse2(const int16_t *src, int stride, int height,
                                     int *sum) {
  int r = 0;
  uint64_t sse = 0;
  do {
    int curr_sum = 0;
    sse += aom_sum_sse_2d_i16_4x4_sse2(src, stride, &curr_sum);
    *sum += curr_sum;
    src += stride << 2;
    r += 4;
  } while (r < height);
  return sse;
}